

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

void __thiscall
kj::_::Debug::Context::logMessage
          (Context *this,LogSeverity severity,char *file,int line,int contextDepth,String *text)

{
  ExceptionCallback *pEVar1;
  char *pcVar2;
  String *pSVar3;
  size_t extraout_RDX;
  undefined4 in_register_00000084;
  char *params_2;
  StringPtr filename;
  undefined1 local_a1 [41];
  StringPtr local_78;
  ArrayPtr<const_char> local_68;
  undefined1 local_58 [8];
  Value_conflict v;
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  Context *this_local;
  
  params_2 = (char *)CONCAT44(in_register_00000084,contextDepth);
  v.description.content.disposer = (ArrayDisposer *)text;
  if ((this->logged & 1U) == 0) {
    ensureInitialized((Value_conflict *)local_58,this);
    pEVar1 = (this->super_ExceptionCallback).next;
    StringPtr::StringPtr(&local_78,(char *)local_58);
    filename.content.size_ = extraout_RDX;
    filename.content.ptr = (char *)local_78.content.size_;
    local_68 = (ArrayPtr<const_char>)trimSourceFilename((kj *)local_78.content.ptr,filename);
    pcVar2 = StringPtr::cStr((StringPtr *)&local_68);
    pSVar3 = mv<kj::String>((String *)&v.line);
    local_a1[0] = 10;
    str<char_const(&)[10],kj::String,char>
              ((String *)(local_a1 + 1),(kj *)0x328b9c,(char (*) [10])pSVar3,(String *)local_a1,
               params_2);
    (*pEVar1->_vptr_ExceptionCallback[4])(pEVar1,0,pcVar2,(ulong)(uint)v.file,0,local_a1 + 1);
    String::~String((String *)(local_a1 + 1));
    this->logged = true;
    Value::~Value((Value *)local_58);
  }
  pEVar1 = (this->super_ExceptionCallback).next;
  pSVar3 = mv<kj::String>((String *)v.description.content.disposer);
  (*pEVar1->_vptr_ExceptionCallback[4])
            (pEVar1,(ulong)severity,file,(ulong)(uint)line,(ulong)(contextDepth + 1),pSVar3);
  return;
}

Assistant:

void Debug::Context::logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                                String&& text) {
  if (!logged) {
    Value v = ensureInitialized();
    next.logMessage(LogSeverity::INFO, trimSourceFilename(v.file).cStr(), v.line, 0,
                    str("context: ", mv(v.description), '\n'));
    logged = true;
  }

  next.logMessage(severity, file, line, contextDepth + 1, mv(text));
}